

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_source_get_cursor_in_pcm_frames(ma_data_source *pDataSource,ma_uint64 *pCursor)

{
  long *in_RSI;
  long *in_RDI;
  ma_uint64 cursor;
  ma_result result;
  ma_data_source_base *pDataSourceBase;
  ulong local_30 [2];
  long *local_20;
  long *local_18;
  ma_result local_4;
  
  if (in_RSI == (long *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    *in_RSI = 0;
    if (in_RDI == (long *)0x0) {
      local_4 = MA_SUCCESS;
    }
    else if (*(long *)(*in_RDI + 0x18) == 0) {
      local_4 = MA_NOT_IMPLEMENTED;
    }
    else {
      local_20 = in_RDI;
      local_18 = in_RSI;
      local_4 = (**(code **)(*in_RDI + 0x18))(in_RDI,local_30);
      if (local_4 == MA_SUCCESS) {
        if (local_30[0] < (ulong)local_20[1]) {
          *local_18 = 0;
        }
        else {
          *local_18 = local_30[0] - local_20[1];
        }
        local_4 = MA_SUCCESS;
      }
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_data_source_get_cursor_in_pcm_frames(ma_data_source* pDataSource, ma_uint64* pCursor)
{
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;
    ma_result result;
    ma_uint64 cursor;

    if (pCursor == NULL) {
        return MA_INVALID_ARGS;
    }

    *pCursor = 0;

    if (pDataSourceBase == NULL) {
        return MA_SUCCESS;
    }

    MA_ASSERT(pDataSourceBase->vtable != NULL);

    if (pDataSourceBase->vtable->onGetCursor == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    result = pDataSourceBase->vtable->onGetCursor(pDataSourceBase, &cursor);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* The cursor needs to be made relative to the start of the range. */
    if (cursor < pDataSourceBase->rangeBegInFrames) {   /* Safety check so we don't return some huge number. */
        *pCursor = 0;
    } else {
        *pCursor = cursor - pDataSourceBase->rangeBegInFrames;
    }

    return MA_SUCCESS;
}